

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::CanGenerateInstallNameDir(cmGeneratorTarget *this,InstallNameType name_type)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmGlobalGenerator *this_00;
  string *target;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  byte local_21;
  PolicyStatus local_20;
  InstallNameType IStack_1c;
  bool skip;
  PolicyStatus cmp0068;
  InstallNameType name_type_local;
  cmGeneratorTarget *this_local;
  
  IStack_1c = name_type;
  _cmp0068 = this;
  local_20 = GetPolicyStatusCMP0068(this);
  if (local_20 == NEW) {
    this_local._7_1_ = true;
  }
  else {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"CMAKE_SKIP_RPATH",&local_49);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_21 = bVar2;
    if (IStack_1c == INSTALL_NAME_FOR_INSTALL) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,"CMAKE_SKIP_INSTALL_RPATH",&local_81);
      bVar2 = cmMakefile::IsOn(pcVar1,&local_80);
      local_21 = (local_21 & 1) != 0 || bVar2;
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a8,"SKIP_BUILD_RPATH",&local_a9);
      bVar2 = GetPropertyAsBool(this,&local_a8);
      local_21 = (local_21 & 1) != 0 || bVar2;
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    if (((local_21 & 1) != 0) && (local_20 == WARN)) {
      this_00 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
      target = GetName_abi_cxx11_(this);
      cmGlobalGenerator::AddCMP0068WarnTarget(this_00,target);
    }
    this_local._7_1_ = (bool)((local_21 ^ 0xff) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::CanGenerateInstallNameDir(
  InstallNameType name_type) const
{
  cmPolicies::PolicyStatus cmp0068 = this->GetPolicyStatusCMP0068();

  if (cmp0068 == cmPolicies::NEW) {
    return true;
  }

  bool skip = this->Makefile->IsOn("CMAKE_SKIP_RPATH");
  if (name_type == INSTALL_NAME_FOR_INSTALL) {
    skip |= this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH");
  } else {
    skip |= this->GetPropertyAsBool("SKIP_BUILD_RPATH");
  }

  if (skip && cmp0068 == cmPolicies::WARN) {
    this->LocalGenerator->GetGlobalGenerator()->AddCMP0068WarnTarget(
      this->GetName());
  }

  return !skip;
}